

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.cpp
# Opt level: O0

_func_void_StatsAccumulator_ptr * __thiscall pbrt::$_9::operator_cast_to_function_pointer(__9 *this)

{
  anon_class_1_0_00000001 *this_local;
  
  return pbrt::anon_class_1_0_00000001::__invoke;
}

Assistant:

std::string ToString(CurveType type) {
    switch (type) {
    case CurveType::Flat:
        return "Flat";
    case CurveType::Cylinder:
        return "Cylinder";
    case CurveType::Ribbon:
        return "Ribbon";
    default:
        LOG_FATAL("Unhandled case");
        return "";
    }
}